

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modulator.cpp
# Opt level: O2

void anon_unknown.dwarf_16a838::Modulator_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  
  if (param != 1) {
    if (param != 2) {
      this = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (this,0xa002,"Invalid modulator float property 0x%04x",(ulong)(uint)param);
      __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
    }
    props = (EffectProps *)&(props->Reverb).Diffusion;
  }
  *val = (props->Reverb).Density;
  return;
}

Assistant:

void Modulator_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_RING_MODULATOR_FREQUENCY:
        *val = props->Modulator.Frequency;
        break;
    case AL_RING_MODULATOR_HIGHPASS_CUTOFF:
        *val = props->Modulator.HighPassCutoff;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid modulator float property 0x%04x", param};
    }
}